

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShutDownRestartTest.cpp
# Opt level: O2

int ShutDownRestartTest(int argc,char **argv)

{
  bool bVar1;
  EStatusCode EVar2;
  LogConfiguration *pLVar3;
  EncryptionOptions *pEVar4;
  PDFUsedFont *inFontReference;
  PDFPage *pPVar5;
  PageContentContext *pPVar6;
  PDFFormXObject *this;
  ObjectIDType inFormXObjectID;
  XObjectContentContext *this_00;
  ResourcesDictionary *this_01;
  string *inOptionalModifiedFile;
  int extraout_EDX;
  int extraout_EDX_00;
  PageContentContext *pPVar7;
  string *inXObjectName;
  int iVar8;
  PDFCreationSettings *inPDFCreationSettings;
  int in_R9D;
  allocator<char> local_1013;
  allocator<char> local_1012;
  allocator<char> local_1011;
  string local_1010;
  string local_ff0;
  string formXObjectName;
  string local_f70;
  string local_f50;
  EncryptionOptions local_f30;
  PDFWriter pdfWriterA;
  
  PDFWriter::PDFWriter(&pdfWriterA);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ff0,"SimpleContentShutdownRestart.pdf",(allocator<char> *)&local_f70);
  BuildRelativeOutputPath(&local_1010,argv,&local_ff0);
  pLVar3 = LogConfiguration::DefaultLogConfiguration();
  pEVar4 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_f30,pEVar4);
  EncryptionOptions::EncryptionOptions
            ((EncryptionOptions *)&formXObjectName._M_string_length,&local_f30);
  inPDFCreationSettings = (PDFCreationSettings *)&formXObjectName;
  formXObjectName._M_dataplus._M_p._0_2_ = 0x101;
  EVar2 = PDFWriter::StartPDF(&pdfWriterA,&local_1010,ePDFVersion13,pLVar3,inPDFCreationSettings);
  iVar8 = (int)inPDFCreationSettings;
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&formXObjectName._M_string_length);
  EncryptionOptions::~EncryptionOptions(&local_f30);
  std::__cxx11::string::~string((string *)&local_1010);
  std::__cxx11::string::~string((string *)&local_ff0);
  if (EVar2 == eSuccess) {
    pPVar5 = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(pPVar5);
    PDFRectangle::PDFRectangle((PDFRectangle *)&formXObjectName,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(pPVar5,(PDFRectangle *)&formXObjectName);
    PDFRectangle::~PDFRectangle((PDFRectangle *)&formXObjectName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f70,"fonts/arial.ttf",&local_1013);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1010,argv[1],(allocator<char> *)&local_f50);
    LocalPathToFileURL((FileURL *)&formXObjectName,&local_1010);
    RelativeURLToLocalPath(&local_ff0,(FileURL *)&formXObjectName,&local_f70);
    FileURL::~FileURL((FileURL *)&formXObjectName);
    std::__cxx11::string::~string((string *)&local_1010);
    inFontReference = PDFWriter::GetFontForFile(&pdfWriterA,&local_ff0,0);
    std::__cxx11::string::~string((string *)&local_ff0);
    std::__cxx11::string::~string((string *)&local_f70);
    if (inFontReference == (PDFUsedFont *)0x0) {
      std::operator<<((ostream *)&std::cout,"Failed to create font object for arial.ttf\n");
    }
    else {
      pPVar6 = PDFWriter::StartPageContentContext(&pdfWriterA,pPVar5);
      if (pPVar6 != (PageContentContext *)0x0) {
        AbstractContentContext::q(&pPVar6->super_AbstractContentContext);
        AbstractContentContext::k(&pPVar6->super_AbstractContentContext,100.0,0.0,0.0,0.0);
        AbstractContentContext::re(&pPVar6->super_AbstractContentContext,100.0,500.0,100.0,100.0);
        AbstractContentContext::f(&pPVar6->super_AbstractContentContext);
        AbstractContentContext::Q(&pPVar6->super_AbstractContentContext);
        pPVar7 = pPVar6;
        EVar2 = PDFWriter::PausePageContentContext(&pdfWriterA,pPVar6);
        if (EVar2 == eSuccess) {
          AbstractContentContext::q(&pPVar6->super_AbstractContentContext);
          AbstractContentContext::k(&pPVar6->super_AbstractContentContext,0.0,100.0,100.0,0.0);
          AbstractContentContext::re(&pPVar6->super_AbstractContentContext,200.0,600.0,200.0,100.0);
          AbstractContentContext::f(&pPVar6->super_AbstractContentContext);
          AbstractContentContext::Q(&pPVar6->super_AbstractContentContext);
          AbstractContentContext::q(&pPVar6->super_AbstractContentContext);
          AbstractContentContext::G(&pPVar6->super_AbstractContentContext,0.5);
          AbstractContentContext::w(&pPVar6->super_AbstractContentContext,3.0);
          AbstractContentContext::m
                    (&pPVar6->super_AbstractContentContext,pPVar7,extraout_EDX,&pLVar3->ShouldLog,
                     iVar8,in_R9D);
          AbstractContentContext::l(&pPVar6->super_AbstractContentContext,400.0,400.0);
          AbstractContentContext::S(&pPVar6->super_AbstractContentContext);
          AbstractContentContext::Q(&pPVar6->super_AbstractContentContext);
          AbstractContentContext::BT(&pPVar6->super_AbstractContentContext);
          AbstractContentContext::k(&pPVar6->super_AbstractContentContext,0.0,0.0,0.0,1.0);
          AbstractContentContext::Tf(&pPVar6->super_AbstractContentContext,inFontReference,1.0);
          AbstractContentContext::Tm
                    (&pPVar6->super_AbstractContentContext,30.0,0.0,0.0,30.0,78.4252,662.8997);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&formXObjectName,"hello world",(allocator<char> *)&local_1010);
          EVar2 = AbstractContentContext::Tj(&pPVar6->super_AbstractContentContext,&formXObjectName)
          ;
          std::__cxx11::string::~string((string *)&formXObjectName);
          if (EVar2 != eSuccess) {
            std::operator<<((ostream *)&std::cout,"Could not find some of the glyphs for this font")
            ;
          }
          AbstractContentContext::ET(&pPVar6->super_AbstractContentContext);
          EVar2 = PDFWriter::EndPageContentContext(&pdfWriterA,pPVar6);
          if (EVar2 == eSuccess) {
            EVar2 = PDFWriter::WritePageAndRelease(&pdfWriterA,pPVar5);
            if (EVar2 == eSuccess) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1010,"ShutDownRestartState.txt",
                         (allocator<char> *)&local_ff0);
              BuildRelativeOutputPath(&formXObjectName,argv,&local_1010);
              EVar2 = PDFWriter::Shutdown(&pdfWriterA,&formXObjectName);
              std::__cxx11::string::~string((string *)&formXObjectName);
              std::__cxx11::string::~string((string *)&local_1010);
              if (EVar2 == eSuccess) {
                EVar2 = eSuccess;
                bVar1 = true;
                goto LAB_001426b5;
              }
              std::operator<<((ostream *)&std::cout,"failed to shutdown library\n");
            }
            else {
              std::operator<<((ostream *)&std::cout,"failed to write page\n");
            }
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
          }
        }
        else {
          std::operator<<((ostream *)&std::cout,"failed to pause page content context\n");
        }
        goto LAB_001426b2;
      }
      std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
    }
    EVar2 = eFailure;
  }
  else {
    std::operator<<((ostream *)&std::cout,"failed to start PDF\n");
  }
LAB_001426b2:
  bVar1 = false;
LAB_001426b5:
  PDFWriter::~PDFWriter(&pdfWriterA);
  if (bVar1) {
    PDFWriter::PDFWriter(&pdfWriterA);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1010,"SimpleContentShutdownRestart.pdf",&local_1013);
    BuildRelativeOutputPath(&formXObjectName,argv,&local_1010);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f70,"ShutDownRestartState.txt",&local_1011);
    BuildRelativeOutputPath(&local_ff0,argv,&local_f70);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f50,"",&local_1012);
    pLVar3 = LogConfiguration::DefaultLogConfiguration();
    inOptionalModifiedFile = &local_f50;
    EVar2 = PDFWriter::ContinuePDF
                      (&pdfWriterA,&formXObjectName,&local_ff0,inOptionalModifiedFile,pLVar3);
    iVar8 = (int)pLVar3;
    std::__cxx11::string::~string((string *)&local_f50);
    std::__cxx11::string::~string((string *)&local_ff0);
    std::__cxx11::string::~string((string *)&local_f70);
    std::__cxx11::string::~string((string *)&formXObjectName);
    std::__cxx11::string::~string((string *)&local_1010);
    if (EVar2 == eSuccess) {
      pPVar5 = (PDFPage *)operator_new(0x2b8);
      PDFPage::PDFPage(pPVar5);
      PDFRectangle::PDFRectangle((PDFRectangle *)&formXObjectName,0.0,0.0,595.0,842.0);
      PDFPage::SetMediaBox(pPVar5,(PDFRectangle *)&formXObjectName);
      PDFRectangle::~PDFRectangle((PDFRectangle *)&formXObjectName);
      pPVar6 = PDFWriter::StartPageContentContext(&pdfWriterA,pPVar5);
      if (pPVar6 == (PageContentContext *)0x0) {
        std::operator<<((ostream *)&std::cout,"failed to create content context for page\n");
      }
      AbstractContentContext::q(&pPVar6->super_AbstractContentContext);
      AbstractContentContext::k(&pPVar6->super_AbstractContentContext,100.0,0.0,0.0,0.0);
      AbstractContentContext::re(&pPVar6->super_AbstractContentContext,100.0,500.0,100.0,100.0);
      AbstractContentContext::f(&pPVar6->super_AbstractContentContext);
      AbstractContentContext::Q(&pPVar6->super_AbstractContentContext);
      EVar2 = PDFWriter::PausePageContentContext(&pdfWriterA,pPVar6);
      if (EVar2 == eSuccess) {
        PDFRectangle::PDFRectangle((PDFRectangle *)&formXObjectName,0.0,0.0,200.0,100.0);
        this = PDFWriter::StartFormXObject
                         (&pdfWriterA,(PDFRectangle *)&formXObjectName,(double *)0x0);
        PDFRectangle::~PDFRectangle((PDFRectangle *)&formXObjectName);
        if (this == (PDFFormXObject *)0x0) {
          std::operator<<((ostream *)&std::cout,"failed to create form xobject\n");
          EVar2 = eFailure;
        }
        else {
          inFormXObjectID = PDFFormXObject::GetObjectID(this);
          this_00 = PDFFormXObject::GetContentContext(this);
          AbstractContentContext::q(&this_00->super_AbstractContentContext);
          AbstractContentContext::k(&this_00->super_AbstractContentContext,0.0,100.0,100.0,0.0);
          AbstractContentContext::re(&this_00->super_AbstractContentContext,0.0,0.0,200.0,100.0);
          AbstractContentContext::f(&this_00->super_AbstractContentContext);
          AbstractContentContext::Q(&this_00->super_AbstractContentContext);
          EVar2 = PDFWriter::EndFormXObjectAndRelease(&pdfWriterA,this);
          if (EVar2 == eSuccess) {
            this_01 = PDFPage::GetResourcesDictionary(pPVar5);
            ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                      (&formXObjectName,this_01,inFormXObjectID);
            AbstractContentContext::q(&pPVar6->super_AbstractContentContext);
            AbstractContentContext::cm
                      (&pPVar6->super_AbstractContentContext,1.0,0.0,0.0,1.0,200.0,600.0);
            inXObjectName = &formXObjectName;
            AbstractContentContext::Do(&pPVar6->super_AbstractContentContext,inXObjectName);
            AbstractContentContext::Q(&pPVar6->super_AbstractContentContext);
            AbstractContentContext::q(&pPVar6->super_AbstractContentContext);
            AbstractContentContext::G(&pPVar6->super_AbstractContentContext,0.5);
            AbstractContentContext::w(&pPVar6->super_AbstractContentContext,3.0);
            AbstractContentContext::m
                      (&pPVar6->super_AbstractContentContext,inXObjectName,extraout_EDX_00,
                       (char *)inOptionalModifiedFile,iVar8,in_R9D);
            AbstractContentContext::l(&pPVar6->super_AbstractContentContext,400.0,400.0);
            AbstractContentContext::S(&pPVar6->super_AbstractContentContext);
            AbstractContentContext::Q(&pPVar6->super_AbstractContentContext);
            AbstractContentContext::q(&pPVar6->super_AbstractContentContext);
            AbstractContentContext::cm
                      (&pPVar6->super_AbstractContentContext,1.0,0.0,0.0,1.0,200.0,200.0);
            AbstractContentContext::Do(&pPVar6->super_AbstractContentContext,&formXObjectName);
            AbstractContentContext::Q(&pPVar6->super_AbstractContentContext);
            EVar2 = PDFWriter::EndPageContentContext(&pdfWriterA,pPVar6);
            if (EVar2 == eSuccess) {
              EVar2 = PDFWriter::WritePageAndRelease(&pdfWriterA,pPVar5);
              if (EVar2 == eSuccess) {
                EVar2 = PDFWriter::EndPDF(&pdfWriterA);
                if (EVar2 == eSuccess) {
                  EVar2 = eSuccess;
                }
                else {
                  std::operator<<((ostream *)&std::cout,"failed in end PDF\n");
                }
              }
              else {
                std::operator<<((ostream *)&std::cout,"failed to write page\n");
              }
            }
            else {
              std::operator<<((ostream *)&std::cout,"failed to end page content context\n");
            }
            std::__cxx11::string::~string((string *)&formXObjectName);
          }
          else {
            std::operator<<((ostream *)&std::cout,"failed to write XObject form\n");
          }
        }
      }
      else {
        std::operator<<((ostream *)&std::cout,"failed to pause page content context\n");
      }
    }
    else {
      std::operator<<((ostream *)&std::cout,"failed to restart library\n");
    }
    PDFWriter::~PDFWriter(&pdfWriterA);
  }
  return (int)(EVar2 != eSuccess);
}

Assistant:

int ShutDownRestartTest(int argc, char* argv[])
{
	EStatusCode status; 

	do
	{
		{
			PDFWriter pdfWriterA;
			status = pdfWriterA.StartPDF(BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),ePDFVersion13);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to start PDF\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PDFUsedFont* font = pdfWriterA.GetFontForFile(BuildRelativeInputPath(argv,"fonts/arial.ttf"));
			if(!font)
			{
				status = PDFHummus::eFailure;
				cout<<"Failed to create font object for arial.ttf\n";
				break;
			}

			PageContentContext* contentContext = pdfWriterA.StartPageContentContext(page);
			if(NULL == contentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
				break;
			}

			// draw a 100X100 points cyan square
			contentContext->q();
			contentContext->k(100,0,0,0);
			contentContext->re(100,500,100,100);
			contentContext->f();
			contentContext->Q();

			// force stream change
			status = pdfWriterA.PausePageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// draw a 200X100 points red rectangle
			contentContext->q();
			contentContext->k(0,100,100,0);
			contentContext->re(200,600,200,100);
			contentContext->f();
			contentContext->Q();

			// draw a gray line
			contentContext->q();
			contentContext->G(0.5);
			contentContext->w(3);
			contentContext->m(200,600);
			contentContext->l(400,400);
			contentContext->S();
			contentContext->Q();

			// Draw some text
			contentContext->BT();
			contentContext->k(0,0,0,1);
			contentContext->Tf(font,1);
			contentContext->Tm(30,0,0,30,78.4252,662.8997);

			EStatusCode encodingStatus = contentContext->Tj("hello world");
			if(encodingStatus != PDFHummus::eSuccess)
				cout<<"Could not find some of the glyphs for this font";

			// continue even if failed...want to see how it looks like
			contentContext->ET();
				
			status = pdfWriterA.EndPageContentContext(contentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterA.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}


			status = pdfWriterA.Shutdown(BuildRelativeOutputPath(argv,"ShutDownRestartState.txt"));
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to shutdown library\n";
				break;
			}

		}
		{
			PDFWriter pdfWriterB;
			status = pdfWriterB.ContinuePDF(
                            BuildRelativeOutputPath(argv,"SimpleContentShutdownRestart.pdf"),
                            BuildRelativeOutputPath(argv,"ShutDownRestartState.txt")
                    );
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to restart library\n";
				break;
			}	

			PDFPage* page = new PDFPage();
			page->SetMediaBox(PDFRectangle(0,0,595,842));

			PageContentContext* pageContentContext = pdfWriterB.StartPageContentContext(page);
			if(NULL == pageContentContext)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create content context for page\n";
			}

			// draw a 100X100 points cyan square
			pageContentContext->q();
			pageContentContext->k(100,0,0,0);
			pageContentContext->re(100,500,100,100);
			pageContentContext->f();
			pageContentContext->Q();

			// pause stream to start writing a form xobject
			status = pdfWriterB.PausePageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to pause page content context\n";
				break;
			}

			// define an xobject form to draw a 200X100 points red rectangle
			PDFFormXObject* xobjectForm = pdfWriterB.StartFormXObject(PDFRectangle(0,0,200,100));
			if(!xobjectForm)
			{
				status = PDFHummus::eFailure;
				cout<<"failed to create form xobject\n";
				break;
			}
			ObjectIDType formObjectID = xobjectForm->GetObjectID();

			XObjectContentContext* xobjectContentContext = xobjectForm->GetContentContext();
			xobjectContentContext->q();
			xobjectContentContext->k(0,100,100,0);
			xobjectContentContext->re(0,0,200,100);
			xobjectContentContext->f();
			xobjectContentContext->Q();

			status = pdfWriterB.EndFormXObjectAndRelease(xobjectForm);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write XObject form\n";
				break;
			}

			string formXObjectName = page->GetResourcesDictionary().AddFormXObjectMapping(formObjectID);

			// continue page drawing, place the form in 200,600
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,600);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			// draw a gray line
			pageContentContext->q();
			pageContentContext->G(0.5);
			pageContentContext->w(3);
			pageContentContext->m(200,600);
			pageContentContext->l(400,400);
			pageContentContext->S();
			pageContentContext->Q();

			// place the form in another location
			pageContentContext->q();
			pageContentContext->cm(1,0,0,1,200,200);
			pageContentContext->Do(formXObjectName);
			pageContentContext->Q();

			status = pdfWriterB.EndPageContentContext(pageContentContext);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to end page content context\n";
				break;
			}

			status = pdfWriterB.WritePageAndRelease(page);
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed to write page\n";
				break;
			}

			status = pdfWriterB.EndPDF();
			if(status != PDFHummus::eSuccess)
			{
				cout<<"failed in end PDF\n";
				break;
			}
		}
	}while(false);
	return status == eSuccess ? 0:1;

}